

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O1

void Omega_h::transfer_densities_and_conserve_coarsen
               (Mesh *old_mesh,TransferOpts *opts,Mesh *new_mesh,LOs *keys2verts,Adj *keys2doms,
               LOs *prods2new_ents,LOs *same_ents2old_ents,LOs *same_ents2new_ents)

{
  int *piVar1;
  uint ent_dim;
  undefined1 auVar2 [12];
  Alloc *pAVar3;
  undefined8 uVar4;
  pointer pCVar5;
  bool bVar6;
  Int IVar7;
  LO LVar8;
  TagBase *tag;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  long lVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  Write<double> new_elem_densities_w;
  Cavs color_cavs;
  LOs keys2prods;
  Adj bdry_keys2doms;
  Cavs init_cavs;
  CavsByBdryStatus cavs;
  ulong in_stack_fffffffffffffc24;
  int local_3b4;
  Write<double> local_3b0;
  Cavs local_3a0;
  undefined1 local_360 [24];
  pointer local_348;
  LOs local_340;
  LOs local_330;
  Write<double> local_320;
  Write<double> local_310;
  Write<double> local_300;
  LOs local_2f0;
  LOs local_2e0;
  Alloc *local_2d0;
  pointer local_2c8;
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  LOs local_2b0;
  LOs local_2a0;
  LOs local_290;
  Mesh *local_280;
  Adj local_278;
  Cavs local_248;
  Cavs local_208;
  Cavs local_1c8;
  Cavs local_188;
  Cavs local_148;
  pointer local_108;
  pointer local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  pointer local_58;
  
  bVar6 = has_densities_or_conserved(old_mesh,opts);
  if (bVar6) {
    local_2d0 = (keys2doms->super_Graph).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_2d0 & 7) == 0 && local_2d0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_2d0 = (Alloc *)(local_2d0->size * 8 + 1);
      }
      else {
        local_2d0->use_count = local_2d0->use_count + 1;
      }
    }
    local_2f0.write_.shared_alloc_.direct_ptr =
         (keys2doms->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
    local_2e0.write_.shared_alloc_.alloc = (keys2verts->write_).shared_alloc_.alloc;
    if (((ulong)local_2e0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_2e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_2e0.write_.shared_alloc_.alloc =
             (Alloc *)((local_2e0.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_2e0.write_.shared_alloc_.alloc)->use_count =
             (local_2e0.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_2e0.write_.shared_alloc_.direct_ptr = (keys2verts->write_).shared_alloc_.direct_ptr;
    local_2f0.write_.shared_alloc_.alloc = local_2d0;
    if (((ulong)local_2d0 & 7) == 0 && local_2d0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_2f0.write_.shared_alloc_.alloc = (Alloc *)(local_2d0->size * 8 + 1);
      }
      else {
        local_2d0->use_count = local_2d0->use_count + 1;
      }
    }
    local_290.write_.shared_alloc_.alloc = (prods2new_ents->write_).shared_alloc_.alloc;
    if (((ulong)local_290.write_.shared_alloc_.alloc & 7) == 0 &&
        local_290.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_290.write_.shared_alloc_.alloc =
             (Alloc *)((local_290.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_290.write_.shared_alloc_.alloc)->use_count =
             (local_290.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_290.write_.shared_alloc_.direct_ptr = (prods2new_ents->write_).shared_alloc_.direct_ptr;
    local_2c8 = (pointer)local_2f0.write_.shared_alloc_.direct_ptr;
    form_initial_cavs(&local_148,old_mesh,new_mesh,0,&local_2e0,&local_2f0,&local_290);
    pAVar3 = local_290.write_.shared_alloc_.alloc;
    if (((ulong)local_290.write_.shared_alloc_.alloc & 7) == 0 &&
        local_290.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_290.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_290.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_2f0.write_.shared_alloc_.alloc;
    if (((ulong)local_2f0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_2f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_2f0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2f0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_2e0.write_.shared_alloc_.alloc;
    if (((ulong)local_2e0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_2e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_2e0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2e0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_278.super_Graph.a2ab.write_.shared_alloc_.alloc =
         (keys2doms->super_Graph).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_278.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_278.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_278.super_Graph.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_278.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_278.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_278.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_278.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
         (keys2doms->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
    local_278.super_Graph.ab2b.write_.shared_alloc_.alloc =
         (keys2doms->super_Graph).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_278.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_278.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_278.super_Graph.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_278.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_278.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_278.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_278.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
         (keys2doms->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
    local_278.codes.write_.shared_alloc_.alloc = (keys2doms->codes).write_.shared_alloc_.alloc;
    if (((ulong)local_278.codes.write_.shared_alloc_.alloc & 7) == 0 &&
        local_278.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_278.codes.write_.shared_alloc_.alloc =
             (Alloc *)((local_278.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_278.codes.write_.shared_alloc_.alloc)->use_count =
             (local_278.codes.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_278.codes.write_.shared_alloc_.direct_ptr =
         (keys2doms->codes).write_.shared_alloc_.direct_ptr;
    local_188.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
         local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_188.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
         local_148.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr;
    local_188.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
         local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_188.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
         local_148.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr;
    local_188.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
         local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_188.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
         local_148.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr;
    local_188.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
         local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_188.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
         local_148.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr;
    local_2a0.write_.shared_alloc_.alloc = (keys2verts->write_).shared_alloc_.alloc;
    if (((ulong)local_2a0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_2a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_2a0.write_.shared_alloc_.alloc =
             (Alloc *)((local_2a0.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_2a0.write_.shared_alloc_.alloc)->use_count =
             (local_2a0.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_2a0.write_.shared_alloc_.direct_ptr = (keys2verts->write_).shared_alloc_.direct_ptr;
    separate_cavities((CavsByBdryStatus *)&stack0xfffffffffffffef8,old_mesh,new_mesh,&local_188,0,
                      &local_2a0,&local_278.super_Graph);
    pAVar3 = local_2a0.write_.shared_alloc_.alloc;
    if (((ulong)local_2a0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_2a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_2a0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2a0.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    Cavs::~Cavs(&local_188);
    ent_dim = old_mesh->dim_;
    if (3 < ent_dim) {
      fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
           ,0x33);
    }
    local_3b4 = 0;
    local_280 = (Mesh *)opts;
    while( true ) {
      IVar7 = Mesh::ntags(old_mesh,ent_dim);
      if (IVar7 <= local_3b4) break;
      tag = Mesh::get_tag(old_mesh,ent_dim,local_3b4);
      bVar6 = should_conserve(old_mesh,opts,ent_dim,tag);
      if (bVar6) {
LAB_0028086e:
        IVar7 = TagBase::ncomps(tag);
        LVar8 = Mesh::nelems(new_mesh);
        local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)&local_3a0.keys2old_elems.ab2b;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"");
        Write<double>::Write(&local_3b0,LVar8 * IVar7,(string *)&local_3a0);
        if (local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc !=
            (Alloc *)&local_3a0.keys2old_elems.ab2b) {
          operator_delete(local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc,
                          (ulong)((long)&(local_3a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)
                                         ->size + 1));
        }
        local_1c8.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (local_108->keys2old_elems).a2ab.write_.shared_alloc_.alloc;
        if (((ulong)local_1c8.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
            local_1c8.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_1c8.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
                 (Alloc *)((local_1c8.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_1c8.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
                 (local_1c8.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_1c8.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
             (local_108->keys2old_elems).a2ab.write_.shared_alloc_.direct_ptr;
        local_1c8.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
             (local_108->keys2old_elems).ab2b.write_.shared_alloc_.alloc;
        if (((ulong)local_1c8.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
            local_1c8.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_1c8.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
                 (Alloc *)((local_1c8.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_1c8.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
                 (local_1c8.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_1c8.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
             (local_108->keys2old_elems).ab2b.write_.shared_alloc_.direct_ptr;
        local_1c8.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
             (local_108->keys2new_elems).a2ab.write_.shared_alloc_.alloc;
        if (((ulong)local_1c8.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
            local_1c8.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_1c8.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
                 (Alloc *)((local_1c8.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_1c8.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
                 (local_1c8.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_1c8.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
             (local_108->keys2new_elems).a2ab.write_.shared_alloc_.direct_ptr;
        local_1c8.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
             (local_108->keys2new_elems).ab2b.write_.shared_alloc_.alloc;
        if (((ulong)local_1c8.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
            local_1c8.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_1c8.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
                 (Alloc *)((local_1c8.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_1c8.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
                 (local_1c8.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_1c8.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
             (local_108->keys2new_elems).ab2b.write_.shared_alloc_.direct_ptr;
        local_300.shared_alloc_.alloc = local_3b0.shared_alloc_.alloc;
        if (((ulong)local_3b0.shared_alloc_.alloc & 7) == 0 &&
            local_3b0.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_300.shared_alloc_.alloc = (Alloc *)((local_3b0.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_3b0.shared_alloc_.alloc)->use_count =
                 (local_3b0.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_300.shared_alloc_.direct_ptr = local_3b0.shared_alloc_.direct_ptr;
        transfer_by_intersection(old_mesh,new_mesh,tag,&local_1c8,&local_300);
        pAVar3 = local_300.shared_alloc_.alloc;
        if (((ulong)local_300.shared_alloc_.alloc & 7) == 0 &&
            local_300.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_300.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_300.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
        Cavs::~Cavs(&local_1c8);
        local_208.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (local_c0->keys2old_elems).a2ab.write_.shared_alloc_.alloc;
        if (((ulong)local_208.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
            local_208.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_208.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
                 (Alloc *)((local_208.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_208.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
                 (local_208.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_208.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
             (local_c0->keys2old_elems).a2ab.write_.shared_alloc_.direct_ptr;
        local_208.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
             (local_c0->keys2old_elems).ab2b.write_.shared_alloc_.alloc;
        if (((ulong)local_208.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
            local_208.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_208.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
                 (Alloc *)((local_208.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_208.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
                 (local_208.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_208.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
             (local_c0->keys2old_elems).ab2b.write_.shared_alloc_.direct_ptr;
        local_208.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
             (local_c0->keys2new_elems).a2ab.write_.shared_alloc_.alloc;
        if (((ulong)local_208.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
            local_208.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_208.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
                 (Alloc *)((local_208.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_208.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
                 (local_208.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_208.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
             (local_c0->keys2new_elems).a2ab.write_.shared_alloc_.direct_ptr;
        local_208.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
             (local_c0->keys2new_elems).ab2b.write_.shared_alloc_.alloc;
        if (((ulong)local_208.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
            local_208.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_208.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
                 (Alloc *)((local_208.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_208.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
                 (local_208.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_208.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
             (local_c0->keys2new_elems).ab2b.write_.shared_alloc_.direct_ptr;
        local_310.shared_alloc_.alloc = local_3b0.shared_alloc_.alloc;
        if (((ulong)local_3b0.shared_alloc_.alloc & 7) == 0 &&
            local_3b0.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_310.shared_alloc_.alloc = (Alloc *)((local_3b0.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_3b0.shared_alloc_.alloc)->use_count =
                 (local_3b0.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_310.shared_alloc_.direct_ptr = local_3b0.shared_alloc_.direct_ptr;
        transfer_by_intersection(old_mesh,new_mesh,tag,&local_208,&local_310);
        pAVar3 = local_310.shared_alloc_.alloc;
        if (((ulong)local_310.shared_alloc_.alloc & 7) == 0 &&
            local_310.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_310.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_310.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
        Cavs::~Cavs(&local_208);
        pCVar5 = local_58;
        for (_Var9._M_pi = local_60._M_pi; opts = (TransferOpts *)local_280,
            (pointer)_Var9._M_pi != pCVar5; _Var9._M_pi = _Var9._M_pi + 0x40) {
          local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
               (((pointer)_Var9._M_pi)->keys2old_elems).a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)(*(long *)&((Write<int> *)
                                       &(local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->
                                        size)->shared_alloc_ * 8 + 1);
            }
            else {
              (local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
                   (local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
               (((pointer)_Var9._M_pi)->keys2old_elems).a2ab.write_.shared_alloc_.direct_ptr;
          local_3a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
               (((pointer)_Var9._M_pi)->keys2old_elems).ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_3a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              local_3a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_3a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)((local_3a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 +
                            1);
            }
            else {
              (local_3a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
                   (local_3a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_3a0.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
               (((pointer)_Var9._M_pi)->keys2old_elems).ab2b.write_.shared_alloc_.direct_ptr;
          local_3a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
               (((pointer)_Var9._M_pi)->keys2new_elems).a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_3a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              local_3a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_3a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)((local_3a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 +
                            1);
            }
            else {
              (local_3a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
                   (local_3a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_3a0.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
               (((pointer)_Var9._M_pi)->keys2new_elems).a2ab.write_.shared_alloc_.direct_ptr;
          local_3a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
               (((pointer)_Var9._M_pi)->keys2new_elems).ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_3a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              local_3a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_3a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)((local_3a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 +
                            1);
            }
            else {
              (local_3a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
                   (local_3a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_3a0.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
               (((pointer)_Var9._M_pi)->keys2new_elems).ab2b.write_.shared_alloc_.direct_ptr;
          local_248.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
               local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_248.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)(*(long *)&((Write<int> *)
                                       &(local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->
                                        size)->shared_alloc_ * 8 + 1);
            }
            else {
              (local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
                   (local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_248.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
               local_3a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_3a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              local_3a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_248.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)((local_3a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 +
                            1);
            }
            else {
              (local_3a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
                   (local_3a0.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_248.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
               local_3a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_3a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              local_3a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_248.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)((local_3a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 +
                            1);
            }
            else {
              (local_3a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
                   (local_3a0.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_248.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
               local_3a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_3a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              local_3a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_248.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)((local_3a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 +
                            1);
            }
            else {
              (local_3a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
                   (local_3a0.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_320.shared_alloc_.alloc = local_3b0.shared_alloc_.alloc;
          if (((ulong)local_3b0.shared_alloc_.alloc & 7) == 0 &&
              local_3b0.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_320.shared_alloc_.alloc =
                   (Alloc *)((local_3b0.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_3b0.shared_alloc_.alloc)->use_count =
                   (local_3b0.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_320.shared_alloc_.direct_ptr = local_3b0.shared_alloc_.direct_ptr;
          local_248.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
               local_3a0.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr;
          local_248.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
               local_3a0.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr;
          local_248.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
               local_3a0.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr;
          local_248.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
               local_3a0.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr;
          transfer_by_intersection(old_mesh,new_mesh,tag,&local_248,&local_320);
          pAVar3 = local_320.shared_alloc_.alloc;
          if (((ulong)local_320.shared_alloc_.alloc & 7) == 0 &&
              local_320.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_320.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_320.shared_alloc_.alloc);
              operator_delete(pAVar3,0x48);
            }
          }
          Cavs::~Cavs(&local_248);
          Cavs::~Cavs(&local_3a0);
        }
        local_330.write_.shared_alloc_.alloc = (same_ents2old_ents->write_).shared_alloc_.alloc;
        if (((ulong)local_330.write_.shared_alloc_.alloc & 7) == 0 &&
            local_330.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_330.write_.shared_alloc_.alloc =
                 (Alloc *)((local_330.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_330.write_.shared_alloc_.alloc)->use_count =
                 (local_330.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_330.write_.shared_alloc_.direct_ptr =
             (same_ents2old_ents->write_).shared_alloc_.direct_ptr;
        local_340.write_.shared_alloc_.alloc = (same_ents2new_ents->write_).shared_alloc_.alloc;
        if (local_340.write_.shared_alloc_.alloc != (Alloc *)0x0 &&
            ((ulong)local_340.write_.shared_alloc_.alloc & 7) == 0) {
          if (entering_parallel == '\x01') {
            local_340.write_.shared_alloc_.alloc =
                 (Alloc *)((local_340.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_340.write_.shared_alloc_.alloc)->use_count =
                 (local_340.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_340.write_.shared_alloc_.direct_ptr =
             (same_ents2new_ents->write_).shared_alloc_.direct_ptr;
        local_360._16_8_ = local_3b0.shared_alloc_.alloc;
        if (((ulong)local_3b0.shared_alloc_.alloc & 7) == 0 &&
            local_3b0.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_360._16_8_ = (local_3b0.shared_alloc_.alloc)->size * 8 + 1;
          }
          else {
            (local_3b0.shared_alloc_.alloc)->use_count =
                 (local_3b0.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_348 = (pointer)local_3b0.shared_alloc_.direct_ptr;
        transfer_common2<double>
                  (old_mesh,new_mesh,ent_dim,&local_330,&local_340,tag,
                   (Write<double> *)(local_360 + 0x10));
        uVar4 = local_360._16_8_;
        if ((local_360._16_8_ & 7) == 0 && (Alloc *)local_360._16_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_360._16_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_360._16_8_);
            operator_delete((void *)uVar4,0x48);
          }
        }
        pAVar3 = local_340.write_.shared_alloc_.alloc;
        if (((ulong)local_340.write_.shared_alloc_.alloc & 7) == 0 &&
            local_340.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_340.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_340.write_.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
        pAVar3 = local_330.write_.shared_alloc_.alloc;
        if (((ulong)local_330.write_.shared_alloc_.alloc & 7) == 0 &&
            local_330.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_330.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_330.write_.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
        pAVar3 = local_3b0.shared_alloc_.alloc;
        if (((ulong)local_3b0.shared_alloc_.alloc & 7) == 0 &&
            local_3b0.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_3b0.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_3b0.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
      }
      else {
        bVar6 = is_density(old_mesh,opts,ent_dim,tag);
        if (bVar6) goto LAB_0028086e;
      }
      local_3b4 = local_3b4 + 1;
    }
    bVar6 = should_conserve_any(old_mesh,opts);
    if (bVar6) {
      local_360._0_8_ = (same_ents2old_ents->write_).shared_alloc_.alloc;
      if ((local_360._0_8_ & 7) == 0 && (Alloc *)local_360._0_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_360._0_8_ = ((Alloc *)local_360._0_8_)->size * 8 + 1;
        }
        else {
          ((Alloc *)local_360._0_8_)->use_count = ((Alloc *)local_360._0_8_)->use_count + 1;
        }
      }
      local_360._8_8_ = (same_ents2old_ents->write_).shared_alloc_.direct_ptr;
      local_2b0.write_.shared_alloc_.alloc = (same_ents2new_ents->write_).shared_alloc_.alloc;
      if (((ulong)local_2b0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_2b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_2b0.write_.shared_alloc_.alloc =
               (Alloc *)((local_2b0.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_2b0.write_.shared_alloc_.alloc)->use_count =
               (local_2b0.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_2b0.write_.shared_alloc_.direct_ptr =
           (same_ents2new_ents->write_).shared_alloc_.direct_ptr;
      local_2c0 = 0x1000101;
      uStack_2bc = 0;
      uStack_2b8 = 0;
      auVar2._8_4_ = 0;
      auVar2._0_8_ = in_stack_fffffffffffffc24;
      transfer_conservation_errors
                ((Omega_h *)old_mesh,(Mesh *)opts,(TransferOpts *)new_mesh,
                 (Mesh *)&stack0xfffffffffffffef8,(CavsByBdryStatus *)local_360,&local_2b0,
                 (LOs *)0x1000101,(OpConservation)(auVar2 << 0x20));
      pAVar3 = local_2b0.write_.shared_alloc_.alloc;
      if (((ulong)local_2b0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_2b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_2b0.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_2b0.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      uVar4 = local_360._0_8_;
      if ((local_360._0_8_ & 7) == 0 && (Alloc *)local_360._0_8_ != (Alloc *)0x0) {
        piVar1 = (int *)(local_360._0_8_ + 0x30);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc((Alloc *)local_360._0_8_);
          operator_delete((void *)uVar4,0x48);
        }
      }
    }
    puVar11 = &stack0xffffffffffffffd0;
    puVar12 = (undefined1 *)&stack0xfffffffffffffef8;
    do {
      lVar10 = 0xc0;
      do {
        std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector
                  ((vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_> *)(puVar12 + lVar10));
        lVar10 = lVar10 + -0x18;
      } while (lVar10 != 0x78);
      puVar11 = puVar11 + -0x48;
      puVar12 = puVar12 + -0x48;
    } while ((pointer *)puVar11 != &stack0xfffffffffffffef8);
    Adj::~Adj(&local_278);
    Cavs::~Cavs(&local_148);
    pAVar3 = local_2d0;
    if (((ulong)local_2d0 & 7) == 0 && local_2d0 != (Alloc *)0x0) {
      piVar1 = &local_2d0->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2d0);
        operator_delete(pAVar3,0x48);
      }
    }
  }
  return;
}

Assistant:

void transfer_densities_and_conserve_coarsen(Mesh* old_mesh,
    TransferOpts const& opts, Mesh* new_mesh, LOs keys2verts, Adj keys2doms,
    LOs prods2new_ents, LOs same_ents2old_ents, LOs same_ents2new_ents) {
  if (!has_densities_or_conserved(old_mesh, opts)) return;
  auto keys2prods = keys2doms.a2ab;
  auto init_cavs = form_initial_cavs(
      old_mesh, new_mesh, VERT, keys2verts, keys2prods, prods2new_ents);
  auto bdry_keys2doms = keys2doms;
  auto cavs = separate_cavities(
      old_mesh, new_mesh, init_cavs, VERT, keys2verts, &bdry_keys2doms);
  auto dim = old_mesh->dim();
  for (Int i = 0; i < old_mesh->ntags(dim); ++i) {
    auto tagbase = old_mesh->get_tag(dim, i);
    if (should_conserve(old_mesh, opts, dim, tagbase) ||
        is_density(old_mesh, opts, dim, tagbase)) {
      auto ncomps = tagbase->ncomps();
      auto new_elem_densities_w = Write<Real>(new_mesh->nelems() * ncomps);
      transfer_by_intersection(old_mesh, new_mesh, tagbase,
          cavs[NOT_BDRY][NO_COLOR][0], new_elem_densities_w);
      transfer_by_intersection(old_mesh, new_mesh, tagbase,
          cavs[TOUCH_BDRY][NO_COLOR][0], new_elem_densities_w);
      for (auto color_cavs : cavs[KEY_BDRY][CLASS_COLOR]) {
        transfer_by_intersection(
            old_mesh, new_mesh, tagbase, color_cavs, new_elem_densities_w);
      }
      transfer_common2(old_mesh, new_mesh, dim, same_ents2old_ents,
          same_ents2new_ents, tagbase, new_elem_densities_w);
    }
  }
  if (!should_conserve_any(old_mesh, opts)) return;
  OpConservation op_conservation;
  op_conservation.density.this_time[NOT_BDRY] = true;
  op_conservation.density.this_time[TOUCH_BDRY] = true;
  op_conservation.density.this_time[KEY_BDRY] = false;
  op_conservation.momentum.this_time[NOT_BDRY] = false;
  op_conservation.momentum.this_time[TOUCH_BDRY] = false;
  op_conservation.momentum.this_time[KEY_BDRY] = false;
  transfer_conservation_errors(old_mesh, opts, new_mesh, cavs,
      same_ents2old_ents, same_ents2new_ents, op_conservation);
}